

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void chold(double *A,int N)

{
  long lVar1;
  double dVar2;
  int i;
  double *C;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  double *pdVar14;
  size_t __n;
  long lVar15;
  
  uVar9 = (ulong)N;
  C = (double *)malloc(uVar9 * uVar9 * 8);
  if (N != 1) {
    uVar12 = N - 1;
    uVar13 = (ulong)uVar12;
    lVar15 = uVar9 * 8;
    uVar12 = uVar12 * uVar12;
    iVar7 = N * -2 + 3;
    pdVar14 = A + (N + 1);
    pdVar10 = A;
    uVar8 = uVar9;
    do {
      dVar2 = *pdVar10;
      if (1 < (long)uVar8) {
        uVar5 = 1;
        do {
          pdVar10[uVar5] = pdVar10[uVar5] / dVar2;
          uVar5 = uVar5 + 1;
        } while ((uVar8 & 0xffffffff) != uVar5);
      }
      uVar5 = uVar8 - 1;
      mmult(pdVar10 + 1,pdVar10 + 1,C,(int)uVar5,1,(int)uVar5);
      uVar3 = 0;
      do {
        C[uVar3] = C[uVar3] * dVar2;
        uVar3 = uVar3 + 1;
      } while (uVar12 != uVar3);
      if (1 < (long)uVar8) {
        uVar8 = 0;
        pdVar4 = C;
        pdVar6 = pdVar14;
        do {
          lVar11 = 0;
          do {
            pdVar6[lVar11] = pdVar6[lVar11] - pdVar4[lVar11];
            lVar1 = uVar8 + lVar11;
            lVar11 = lVar11 + 1;
          } while (lVar1 + 1 < (long)uVar5);
          uVar8 = uVar8 + 1;
          pdVar6 = pdVar6 + uVar9 + 1;
          pdVar4 = (double *)((long)pdVar4 + lVar15);
        } while (uVar8 != uVar13);
      }
      pdVar10 = pdVar10 + uVar9 + 1;
      uVar13 = uVar13 - 1;
      uVar12 = uVar12 + iVar7;
      iVar7 = iVar7 + 2;
      pdVar14 = pdVar14 + uVar9 + 1;
      lVar15 = lVar15 + -8;
      uVar8 = uVar5;
    } while (uVar5 != 1);
    if (N < 1) goto LAB_001213ae;
  }
  __n = 0;
  uVar8 = 0;
  uVar9 = 0;
  do {
    if (uVar9 != 0) {
      memset(A + uVar8,0,__n);
    }
    uVar9 = uVar9 + 1;
    uVar8 = (ulong)(uint)((int)uVar8 + N);
    __n = __n + 8;
  } while ((uint)N != uVar9);
LAB_001213ae:
  free(C);
  return;
}

Assistant:

void chold(double *A, int N) {
	int stride,i,j,t;
	double *U22;
	U22 = (double*) malloc(sizeof(double) * N * N);
	stride = N; 
	
	rchold(A,N,stride,U22);
	
	for(i=0; i < N;++i) {
		t = i *N;
		for(j=0;j < i;++j) {
			A[t+j] = 0.;
		}
	}

	free(U22);
	
}